

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_combined<_IO_FILE*>
               (IsoForest *model,ExtIsoForest *model_ext,Imputer *imputer,TreesIndexer *indexer,
               char *optional_metadata,size_t size_optional_metadata,_IO_FILE **out)

{
  SignalSwitcher *pSVar1;
  runtime_error *this;
  IsoForest *in_RCX;
  long in_RDX;
  long in_RSI;
  _IO_FILE **in_RDI;
  _IO_FILE **in_R8;
  long in_R9;
  Imputer *unaff_retaddr;
  long end_pos;
  size_t jump_ahead;
  uint8_t ending_type;
  size_t size_model;
  uint8_t model_type;
  long pos_watermark;
  SignalSwitcher ss;
  long in_stack_ffffffffffffff68;
  SignalSwitcher *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  _IO_FILE **in_stack_ffffffffffffff88;
  TreesIndexer *in_stack_ffffffffffffff90;
  Imputer *in_stack_ffffffffffffffb0;
  
  SignalSwitcher::SignalSwitcher(in_stack_ffffffffffffff70);
  pSVar1 = (SignalSwitcher *)set_return_position((FILE *)0x652fe0);
  add_setup_info<_IO_FILE*>((_IO_FILE **)pSVar1,SUB81(in_stack_ffffffffffffff78 >> 0x38,0));
  write_bytes<unsigned_char>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  if ((in_RDI == (_IO_FILE **)0x0) && (in_RSI == 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Must pass one of \'model\' or \'model_ext\'.\n");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  write_bytes<unsigned_char>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  if (in_RDI == (_IO_FILE **)0x0) {
    get_size_model((ExtIsoForest *)in_stack_ffffffffffffffb0);
  }
  else {
    get_size_model((IsoForest *)in_stack_ffffffffffffffb0);
  }
  write_bytes<unsigned_long>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  if (in_RDX != 0) {
    get_size_model(in_stack_ffffffffffffffb0);
  }
  write_bytes<unsigned_long>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  if (in_RCX != (IsoForest *)0x0) {
    get_size_model(in_stack_ffffffffffffff90);
  }
  write_bytes<unsigned_long>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  write_bytes<unsigned_long>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  check_interrupt_switch(pSVar1);
  if (in_RDI == (_IO_FILE **)0x0) {
    serialize_model<_IO_FILE*>((ExtIsoForest *)unaff_retaddr,(_IO_FILE **)0x0);
  }
  else {
    serialize_model<_IO_FILE*>(in_RCX,in_R8);
  }
  if (in_RDX != 0) {
    serialize_model<_IO_FILE*>(unaff_retaddr,in_RDI);
  }
  if (in_RCX != (IsoForest *)0x0) {
    serialize_model<_IO_FILE*>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (in_R9 != 0) {
    write_bytes<char>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  }
  check_interrupt_switch(pSVar1);
  write_bytes<unsigned_char>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  write_bytes<unsigned_long>(pSVar1,in_stack_ffffffffffffff78,(FILE **)in_stack_ffffffffffffff70);
  pSVar1 = (SignalSwitcher *)set_return_position((FILE *)0x6533a9);
  return_to_position((FILE **)pSVar1,in_stack_ffffffffffffff68);
  add_full_watermark<_IO_FILE*>((_IO_FILE **)0x6533db);
  return_to_position((FILE **)pSVar1,in_stack_ffffffffffffff68);
  SignalSwitcher::~SignalSwitcher(pSVar1);
  return;
}

Assistant:

void serialize_combined
(
    const IsoForest *model,
    const ExtIsoForest *model_ext,
    const Imputer *imputer,
    const TreesIndexer *indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    otype &out
)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);

    add_setup_info(out, false);
    uint8_t model_type = AllObjectsCombined;
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    if (model != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelNext;
                else
                    model_type = HasSingleVarModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }

    }

    else if (model_ext != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelNext;
                else
                    model_type = HasExtModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelPlusMetadataNext;
                else
                    model_type = HasExtModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }
    }

    else {
        throw std::runtime_error("Must pass one of 'model' or 'model_ext'.\n");
    }

    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    size_t size_model;
    if (model != NULL)
        size_model = get_size_model(*model);
    else
        size_model = get_size_model(*model_ext);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (imputer != NULL)
        size_model = get_size_model(*imputer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (indexer != NULL)
        size_model = get_size_model(*indexer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    write_bytes<size_t>((void*)&size_optional_metadata, (size_t)1, out);


    check_interrupt_switch(ss);

    if (model != NULL)
        serialize_model(*model, out);
    else
        serialize_model(*model_ext, out);

    if (imputer != NULL)
        serialize_model(*imputer, out);

    if (indexer != NULL)
        serialize_model(*indexer, out);

    if (size_optional_metadata)
        write_bytes<char>((void*)optional_metadata, size_optional_metadata, out);

    check_interrupt_switch(ss);

    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}